

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O2

int evfilt_proc_knote_delete(filter *filt,knote *kn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = 0;
  if (((kn->kev).flags & 8) == 0) {
    iVar1 = evfilt_proc_knote_disable(filt,kn);
  }
  iVar2 = close((kn->field_10).kn_timerfd);
  iVar3 = -1;
  if (-1 < iVar2) {
    iVar3 = iVar1;
  }
  (kn->field_10).kn_timerfd = -1;
  return iVar3;
}

Assistant:

int
evfilt_proc_knote_delete(struct filter *filt, struct knote *kn)
{
    int rv = 0;

    /* If it's enabled, we need to remove the pidfd from epoll */
    if (KNOTE_ENABLED(kn) && (evfilt_proc_knote_disable(filt, kn) < 0)) rv = -1;

    dbg_printf("closed pidfd=%i", kn->kn_procfd);
    if (close(kn->kn_procfd) < 0) rv = -1;
    kn->kn_procfd = -1;

    return (rv);
}